

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
          (SACSubcaseBase *this,GLuint size,GLuint *values,GLuint min_value)

{
  uint local_30;
  GLuint i;
  GLuint min_value_local;
  GLuint *values_local;
  GLuint size_local;
  SACSubcaseBase *this_local;
  
  std::sort<unsigned_int*>(values,values + size);
  local_30 = 0;
  while( true ) {
    if (size <= local_30) {
      return true;
    }
    anon_unknown_0::Output("%u\n",(ulong)values[local_30]);
    if (values[local_30] != local_30 + min_value) break;
    local_30 = local_30 + 1;
  }
  anon_unknown_0::Output
            ("Counter value is %u should be %u.\n",(ulong)values[local_30],
             (ulong)(local_30 + min_value));
  return false;
}

Assistant:

bool CheckCounterValues(GLuint size, GLuint* values, GLuint min_value)
	{
		std::sort(values, values + size);
		for (GLuint i = 0; i < size; ++i)
		{
			Output("%u\n", values[i]);
			if (values[i] != i + min_value)
			{
				Output("Counter value is %u should be %u.\n", values[i], i + min_value);
				return false;
			}
		}
		return true;
	}